

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  Wln_Ntk_t *pWVar6;
  Wln_Vec_t *pWVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if (-1 < iObj) {
    uVar4 = (ulong)(uint)iObj;
    if (iObj < (p->pNtk->vTypes).nSize) {
      pcVar5 = Abc_OperName((p->pNtk->vTypes).pArray[uVar4]);
      pWVar6 = p->pNtk;
      if ((iObj < (pWVar6->vNameIds).nSize) && (iObj < (pWVar6->vInstIds).nSize)) {
        printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",uVar4,pcVar5,
               (ulong)(uint)(pWVar6->vNameIds).pArray[uVar4],
               (ulong)(uint)(pWVar6->vInstIds).pArray[uVar4],
               (ulong)(uint)pWVar6->vFanins[uVar4].nSize);
        pWVar6 = p->pNtk;
        pWVar7 = pWVar6->vFanins;
        if (0 < pWVar7[uVar4].nSize) {
          lVar11 = 0;
          do {
            iVar1 = (p->vFanins).nSize;
            if (iVar1 <= iObj) goto LAB_00386cc2;
            piVar3 = (p->vFanins).pArray;
            lVar10 = (long)piVar3[uVar4];
            if ((lVar10 < 0) || (iVar1 <= piVar3[uVar4])) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            iVar1 = piVar3[lVar10 + lVar11 * 2];
            lVar8 = (long)iVar1;
            if (lVar8 != 0) {
              if (pWVar7[lVar8].nSize == 0) {
                if ((iVar1 < 0) || ((pWVar6->vTypes).nSize <= iVar1)) goto LAB_00386cc2;
                if ((pWVar6->vTypes).pArray[lVar8] != 3) goto LAB_00386c92;
              }
              printf("%5d ");
              uVar2 = piVar3[lVar10 + lVar11 * 2 + 1];
              uVar9 = (ulong)uVar2;
              if (uVar9 != 0) {
                if ((((int)uVar2 < 0) || (iVar1 = (p->vEdgeLinks).nSize, iVar1 <= (int)uVar2)) ||
                   (iVar1 <= (int)(uVar2 + 1))) goto LAB_00386cc2;
                piVar3 = (p->vEdgeLinks).pArray;
                printf("(%d : %d %d) ",uVar9,(ulong)(uint)piVar3[uVar9],
                       (ulong)(uint)piVar3[uVar2 + 1]);
              }
            }
LAB_00386c92:
            lVar11 = lVar11 + 1;
            pWVar6 = p->pNtk;
            pWVar7 = pWVar6->vFanins;
          } while (lVar11 < pWVar7[uVar4].nSize);
        }
        putchar(10);
        return;
      }
    }
  }
LAB_00386cc2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}